

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

_Bool netaddr_isequal_binary(netaddr *addr,void *bin,size_t len,uint16_t af,uint8_t prefix_len)

{
  byte bVar1;
  int iVar2;
  uint32_t addr_len;
  uint8_t prefix_len_local;
  uint16_t af_local;
  size_t len_local;
  void *bin_local;
  netaddr *addr_local;
  
  if ((addr->_type == af) && (addr->_prefix_len == prefix_len)) {
    bVar1 = netaddr_get_af_maxprefix((uint)addr->_type);
    if ((uint)((int)(uint)bVar1 >> 3) == len) {
      iVar2 = memcmp(addr,bin,(ulong)(uint)((int)(uint)bVar1 >> 3));
      addr_local._7_1_ = iVar2 == 0;
    }
    else {
      addr_local._7_1_ = false;
    }
  }
  else {
    addr_local._7_1_ = false;
  }
  return addr_local._7_1_;
}

Assistant:

bool
netaddr_isequal_binary(const struct netaddr *addr, const void *bin, size_t len, uint16_t af, uint8_t prefix_len) {
  uint32_t addr_len;

  if (addr->_type != af || addr->_prefix_len != prefix_len) {
    return false;
  }

  addr_len = netaddr_get_maxprefix(addr) >> 3;
  if (addr_len != len) {
    return false;
  }

  return memcmp(addr->_addr, bin, addr_len) == 0;
}